

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmem_allocator.h
# Opt level: O2

void __thiscall
cppcms::impl::shmem_allocator<$66a57a36$>::free(shmem_allocator<_66a57a36_> *this,void *__ptr)

{
  shmem_control::free(process_settings::process_memory,__ptr);
  return;
}

Assistant:

void free(void *p) const
	{
		return mm->free(p);
	}